

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O1

Wln_Ntk_t * Wln_NtkAlloc(char *pName,int nObjsMax)

{
  uint uVar1;
  Wln_Ntk_t *pWVar2;
  char *pcVar3;
  int *piVar4;
  Wln_Vec_t *pWVar5;
  Hash_IntMan_t *p;
  Vec_Int_t *pVVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  size_t __size;
  size_t __size_00;
  
  pWVar2 = (Wln_Ntk_t *)calloc(1,0x458);
  if (pName == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = Extra_FileNameGeneric(pName);
  }
  pWVar2->pName = pcVar3;
  if ((pWVar2->vCis).nCap < 0x6f) {
    piVar4 = (pWVar2->vCis).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc(0x1bc);
    }
    else {
      piVar4 = (int *)realloc(piVar4,0x1bc);
    }
    (pWVar2->vCis).pArray = piVar4;
    if (piVar4 == (int *)0x0) goto LAB_0035fcd0;
    (pWVar2->vCis).nCap = 0x6f;
  }
  if ((pWVar2->vCos).nCap < 0x6f) {
    piVar4 = (pWVar2->vCos).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc(0x1bc);
    }
    else {
      piVar4 = (int *)realloc(piVar4,0x1bc);
    }
    (pWVar2->vCos).pArray = piVar4;
    if (piVar4 == (int *)0x0) goto LAB_0035fcd0;
    (pWVar2->vCos).nCap = 0x6f;
  }
  if ((pWVar2->vFfs).nCap < 0x6f) {
    piVar4 = (pWVar2->vFfs).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc(0x1bc);
    }
    else {
      piVar4 = (int *)realloc(piVar4,0x1bc);
    }
    (pWVar2->vFfs).pArray = piVar4;
    if (piVar4 == (int *)0x0) goto LAB_0035fcd0;
    (pWVar2->vFfs).nCap = 0x6f;
  }
  iVar10 = nObjsMax + 1;
  __size = (size_t)iVar10;
  if ((pWVar2->vTypes).nCap <= nObjsMax) {
    piVar4 = (pWVar2->vTypes).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc(__size * 4);
    }
    else {
      piVar4 = (int *)realloc(piVar4,__size * 4);
    }
    (pWVar2->vTypes).pArray = piVar4;
    if (piVar4 == (int *)0x0) goto LAB_0035fcd0;
    (pWVar2->vTypes).nCap = iVar10;
  }
  if ((pWVar2->vSigns).nCap <= nObjsMax) {
    pcVar3 = (pWVar2->vSigns).pArray;
    if (pcVar3 == (char *)0x0) {
      pcVar3 = (char *)malloc(__size);
    }
    else {
      pcVar3 = (char *)realloc(pcVar3,__size);
    }
    (pWVar2->vSigns).pArray = pcVar3;
    (pWVar2->vSigns).nCap = iVar10;
  }
  if ((pWVar2->vRanges).nCap <= nObjsMax) {
    piVar4 = (pWVar2->vRanges).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc(__size * 4);
    }
    else {
      piVar4 = (int *)realloc(piVar4,__size * 4);
    }
    (pWVar2->vRanges).pArray = piVar4;
    if (piVar4 == (int *)0x0) {
LAB_0035fcd0:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (pWVar2->vRanges).nCap = iVar10;
  }
  Vec_IntPush(&pWVar2->vTypes,-1);
  uVar9 = (pWVar2->vSigns).nSize;
  uVar8 = (pWVar2->vSigns).nCap;
  if (uVar9 == uVar8) {
    if ((int)uVar8 < 0x10) {
      pcVar3 = (pWVar2->vSigns).pArray;
      if (pcVar3 == (char *)0x0) {
        pcVar3 = (char *)malloc(0x10);
      }
      else {
        pcVar3 = (char *)realloc(pcVar3,0x10);
      }
      (pWVar2->vSigns).pArray = pcVar3;
      __size_00 = 0x10;
    }
    else {
      __size_00 = (ulong)uVar8 * 2;
      if ((int)__size_00 <= (int)uVar8) goto LAB_0035fb73;
      pcVar3 = (pWVar2->vSigns).pArray;
      if (pcVar3 == (char *)0x0) {
        pcVar3 = (char *)malloc(__size_00);
      }
      else {
        pcVar3 = (char *)realloc(pcVar3,__size_00);
      }
      (pWVar2->vSigns).pArray = pcVar3;
    }
    (pWVar2->vSigns).nCap = (int)__size_00;
  }
LAB_0035fb73:
  uVar7 = (ulong)(uVar9 + 1);
  (pWVar2->vSigns).nSize = uVar9 + 1;
  (pWVar2->vSigns).pArray[(int)uVar9] = -1;
  Vec_IntPush(&pWVar2->vRanges,-1);
  pWVar5 = (Wln_Vec_t *)calloc(__size,0x10);
  pWVar2->vFanins = pWVar5;
  p = (Hash_IntMan_t *)calloc(1,0x18);
  uVar9 = 1099;
  while( true ) {
    do {
      uVar8 = uVar9;
      uVar9 = uVar8 + 1;
    } while ((uVar8 & 1) != 0);
    if (uVar9 < 9) break;
    uVar7 = 5;
    while( true ) {
      iVar10 = (int)uVar7;
      if (uVar9 % (iVar10 - 2U) == 0) break;
      uVar7 = (ulong)(iVar10 + 2);
      if (uVar9 < (uint)(iVar10 * iVar10)) goto LAB_0035fbef;
    }
  }
LAB_0035fbef:
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  uVar1 = 0x10;
  if (0xe < uVar8) {
    uVar1 = uVar9;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = uVar1;
  piVar4 = (int *)malloc((long)(int)uVar1 << 2);
  pVVar6->pArray = piVar4;
  pVVar6->nSize = uVar9;
  if (piVar4 != (int *)0x0) {
    memset(piVar4,0,(long)(int)uVar9 << 2);
  }
  p->vTable = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 0x1130;
  pVVar6->nSize = 0;
  piVar4 = (int *)malloc(0x44c0);
  pVVar6->pArray = piVar4;
  p->vObjs = pVVar6;
  piVar4[0] = 0;
  piVar4[1] = 0;
  piVar4[2] = 0;
  piVar4[3] = 0;
  pVVar6->nSize = 4;
  p->nRefs = 1;
  pWVar2->pRanges = p;
  iVar10 = 0;
  do {
    Hash_Int2ManInsert(p,iVar10,iVar10,(int)uVar7);
    iVar10 = iVar10 + 1;
  } while (iVar10 != 0x41);
  iVar10 = 1;
  do {
    Hash_Int2ManInsert(p,iVar10,0,(int)uVar7);
    iVar10 = iVar10 + 1;
  } while (iVar10 != 0x40);
  if ((p->vObjs->nSize & 0xfffffffcU) == 0x204) {
    return pWVar2;
  }
  __assert_fail("Hash_IntManEntryNum(p->pRanges) == 128",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnNtk.c"
                ,0x41,"Wln_Ntk_t *Wln_NtkAlloc(char *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creating networks.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Wln_Ntk_t * Wln_NtkAlloc( char * pName, int nObjsMax )
{
    Wln_Ntk_t * p; int i;
    p = ABC_CALLOC( Wln_Ntk_t, 1 );
    p->pName = pName ? Extra_FileNameGeneric( pName ) : NULL;
    Vec_IntGrow( &p->vCis, 111 );
    Vec_IntGrow( &p->vCos, 111 );
    Vec_IntGrow( &p->vFfs, 111 );
    Vec_IntGrow( &p->vTypes,  nObjsMax+1 );
    Vec_StrGrow( &p->vSigns,  nObjsMax+1 );
    Vec_IntGrow( &p->vRanges, nObjsMax+1 );
    Vec_IntPush( &p->vTypes,  -1 );
    Vec_StrPush( &p->vSigns,  -1 );
    Vec_IntPush( &p->vRanges, -1 );
    p->vFanins = ABC_CALLOC( Wln_Vec_t, nObjsMax+1 );
    p->pRanges = Hash_IntManStart( 1000 );
    for ( i = 0; i < 65; i++ )
        Hash_Int2ManInsert( p->pRanges, i, i, 0 );
    for ( i = 1; i < 64; i++ )
        Hash_Int2ManInsert( p->pRanges, i, 0, 0 );
    assert( Hash_IntManEntryNum(p->pRanges) == 128 );
    return p;
}